

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::anon_unknown_18::MockObjectRegistry::~MockObjectRegistry(MockObjectRegistry *this)

{
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  int in_ECX;
  char *pcVar4;
  string local_60;
  MockObjectState *local_40;
  MockObjectState *state;
  _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
  local_30;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
  local_20;
  const_iterator it;
  int leaked_count;
  MockObjectRegistry *this_local;
  
  if ((FLAGS_gmock_catch_leaked_mocks & 1) == 0) {
    it._M_node._4_4_ = 1;
  }
  else {
    it._M_node._0_4_ = 0;
    local_28._M_node =
         (_Base_ptr)
         std::
         map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
         ::begin(&this->states_);
    std::
    _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
    ::_Rb_tree_const_iterator(&local_20,&local_28);
    while( true ) {
      state = (MockObjectState *)
              std::
              map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
              ::end(&this->states_);
      std::
      _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
      ::_Rb_tree_const_iterator(&local_30,(iterator *)&state);
      bVar1 = std::operator!=(&local_20,&local_30);
      if (!bVar1) break;
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
               ::operator->(&local_20);
      if (((ppVar2->second).leakable & 1U) == 0) {
        std::operator<<((ostream *)&std::cout,"\n");
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
                 ::operator->(&local_20);
        local_40 = &ppVar2->second;
        internal::FormatFileLocation_abi_cxx11_
                  (&local_60,(internal *)local_40->first_used_file,
                   (char *)(ulong)(uint)(ppVar2->second).first_used_line,in_ECX);
        std::operator<<((ostream *)&std::cout,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::operator<<((ostream *)&std::cout," ERROR: this mock object");
        bVar1 = std::operator!=(&local_40->first_used_test,"");
        if (bVar1) {
          poVar3 = std::operator<<((ostream *)&std::cout," (used in test ");
          poVar3 = std::operator<<(poVar3,(string *)&local_40->first_used_test_case);
          poVar3 = std::operator<<(poVar3,".");
          poVar3 = std::operator<<(poVar3,(string *)&local_40->first_used_test);
          std::operator<<(poVar3,")");
        }
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 " should be deleted but never is. Its address is @");
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
                 ::operator->(&local_20);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,ppVar2->first);
        std::operator<<(poVar3,".");
        it._M_node._0_4_ = (int)it._M_node + 1;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
      ::operator++(&local_20);
    }
    if (0 < (int)it._M_node) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\nERROR: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)it._M_node);
      poVar3 = std::operator<<(poVar3," leaked mock ");
      pcVar4 = "objects";
      if ((int)it._M_node == 1) {
        pcVar4 = "object";
      }
      poVar3 = std::operator<<(poVar3,pcVar4);
      std::operator<<(poVar3," found at program exit.\n");
      std::ostream::flush();
      std::ostream::flush();
      _exit(1);
    }
    it._M_node._4_4_ = 0;
  }
  std::
  map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
  ::~map(&this->states_);
  return;
}

Assistant:

~MockObjectRegistry() {
    // "using ::std::cout;" doesn't work with Symbian's STLport, where cout is
    // a macro.

    if (!GMOCK_FLAG(catch_leaked_mocks))
      return;

    int leaked_count = 0;
    for (StateMap::const_iterator it = states_.begin(); it != states_.end();
         ++it) {
      if (it->second.leakable)  // The user said it's fine to leak this object.
        continue;

      // TODO(wan@google.com): Print the type of the leaked object.
      // This can help the user identify the leaked object.
      std::cout << "\n";
      const MockObjectState& state = it->second;
      std::cout << internal::FormatFileLocation(state.first_used_file,
                                                state.first_used_line);
      std::cout << " ERROR: this mock object";
      if (state.first_used_test != "") {
        std::cout << " (used in test " << state.first_used_test_case << "."
             << state.first_used_test << ")";
      }
      std::cout << " should be deleted but never is. Its address is @"
           << it->first << ".";
      leaked_count++;
    }
    if (leaked_count > 0) {
      std::cout << "\nERROR: " << leaked_count
           << " leaked mock " << (leaked_count == 1 ? "object" : "objects")
           << " found at program exit.\n";
      std::cout.flush();
      ::std::cerr.flush();
      // RUN_ALL_TESTS() has already returned when this destructor is
      // called.  Therefore we cannot use the normal Google Test
      // failure reporting mechanism.
      _exit(1);  // We cannot call exit() as it is not reentrant and
                 // may already have been called.
    }
  }